

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flash.c
# Opt level: O2

void complete_flash_command(gbamem_t *mem,gbabus_t *bus)

{
  switch(mem->flash_command << 0x1c | mem->flash_command - 0xaa5510 >> 4) {
  case 0:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
            ,0x5d);
    fwrite("FLASHC_ERASE_ENTIRE_CHIP should be handled by the state machine below, as it is a subcommand.\n\x1b[0;m"
           ,99,1,_stderr);
    goto LAB_0011be02;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
            ,0x5f);
    fprintf(_stderr,"Unimplemented flash command: 0x%06X\n\x1b[0;m",(ulong)mem->flash_command);
LAB_0011be02:
    exit(1);
  case 7:
    mem->flash_state = FLASH_ERASE;
    break;
  case 8:
    mem->flash_state = FLASH_CHIP_ID;
    break;
  case 9:
    if (atmel) {
      mem->flash_state = FLASH_ERASE_WRITE_SECTOR;
    }
    else {
      mem->flash_state = FLASH_WRITE_SINGLE_BYTE;
    }
    break;
  case 10:
    mem->flash_state = FLASH_BANKSWITCH;
    break;
  case 0xe:
    mem->flash_state = FLASH_READY;
  }
  return;
}

Assistant:

void complete_flash_command(gbamem_t* mem, gbabus_t* bus) {
    switch (mem->flash_command) {
        case FLASHC_CHIP_ID:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_CHIP_ID\n");
#endif
            mem->flash_state = FLASH_CHIP_ID;
            break;
        case FLASHC_EXIT_CHIP_ID:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_EXIT_CHIP_ID\n");
#endif
            mem->flash_state = FLASH_READY;
            break;
        case FLASHC_BANKSWITCH:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_BANKSWITCH\n");
#endif
            mem->flash_state = FLASH_BANKSWITCH;
            break;
        case FLASHC_ERASE:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_ERASE\n");
#endif
            mem->flash_state = FLASH_ERASE;
            break;
        case FLASHC_WRITE_DATA:
            if (atmel) {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASH_ERASE_WRITE_SECTOR\n");
#endif
                mem->flash_state = FLASH_ERASE_WRITE_SECTOR;
            } else {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASH_WRITE_SINGLE_BYTE\n");
#endif
                mem->flash_state = FLASH_WRITE_SINGLE_BYTE;
            }
            break;
        case FLASHC_ERASE_ENTIRE_CHIP:
            logfatal("FLASHC_ERASE_ENTIRE_CHIP should be handled by the state machine below, as it is a subcommand.")
        default:
            logfatal("Unimplemented flash command: 0x%06X", mem->flash_command)
    }
}